

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_dec.c
# Opt level: O2

void VP8ParseProba(VP8BitReader *br,VP8Decoder *dec)

{
  VP8BandProbas (*paVVar1) [8];
  uint8_t uVar2;
  int iVar3;
  long lVar5;
  long lVar6;
  VP8BandProbas *pVVar7;
  VP8BandProbas *pVVar8;
  long lVar9;
  long lVar10;
  uint8_t (*pauVar11) [11];
  uint8_t (*pauVar12) [11];
  uint8_t (*pauVar13) [11];
  uint8_t (*pauVar14) [11];
  VP8BandProbas *local_90;
  uint8_t (*local_88) [11];
  uint8_t (*local_80) [11];
  VP8BandProbas *(*local_78) [17];
  uint32_t uVar4;
  
  paVVar1 = (dec->proba).bands;
  local_78 = (dec->proba).bands_ptr;
  local_80 = (uint8_t (*) [11])CoeffsUpdateProba;
  local_88 = (uint8_t (*) [11])CoeffsProba0;
  lVar9 = 0;
  local_90 = *paVVar1;
  for (; lVar9 != 4; lVar9 = lVar9 + 1) {
    pVVar7 = local_90;
    pauVar11 = local_80;
    pauVar13 = local_88;
    for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
      pVVar8 = pVVar7;
      pauVar12 = pauVar11;
      pauVar14 = pauVar13;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        for (lVar10 = 0; lVar10 != 0xb; lVar10 = lVar10 + 1) {
          iVar3 = VP8GetBit(br,(uint)(*(uint8_t (*) [3] [11])*pauVar12)[0][lVar10]);
          if (iVar3 == 0) {
            uVar2 = (*(uint8_t (*) [3] [11])*pauVar14)[0][lVar10];
          }
          else {
            uVar4 = VP8GetValue(br,8);
            uVar2 = (uint8_t)uVar4;
          }
          (*(VP8BandProbas (*) [8])pVVar8)[0].probas[0][lVar10] = uVar2;
        }
        pauVar12 = pauVar12 + 1;
        pauVar14 = pauVar14 + 1;
        pVVar8 = (VP8BandProbas *)((*(VP8BandProbas (*) [8])pVVar8)[0].probas + 1);
      }
      pauVar11 = pauVar11 + 3;
      pauVar13 = pauVar13 + 3;
      pVVar7 = pVVar7 + 1;
    }
    for (lVar5 = 0; lVar5 != 0x11; lVar5 = lVar5 + 1) {
      (*local_78)[lVar5] = paVVar1[lVar9] + ""[lVar5];
    }
    local_80 = local_80 + 0x18;
    local_88 = local_88 + 0x18;
    local_90 = local_90 + 8;
    local_78 = local_78 + 1;
  }
  uVar4 = VP8GetValue(br,1);
  dec->use_skip_proba = uVar4;
  if (uVar4 != 0) {
    uVar4 = VP8GetValue(br,8);
    dec->skip_p = (uint8_t)uVar4;
  }
  return;
}

Assistant:

void VP8ParseProba(VP8BitReader* const br, VP8Decoder* const dec) {
  VP8Proba* const proba = &dec->proba;
  int t, b, c, p;
  for (t = 0; t < NUM_TYPES; ++t) {
    for (b = 0; b < NUM_BANDS; ++b) {
      for (c = 0; c < NUM_CTX; ++c) {
        for (p = 0; p < NUM_PROBAS; ++p) {
          const int v =
              VP8GetBit(br, CoeffsUpdateProba[t][b][c][p], "global-header") ?
                        VP8GetValue(br, 8, "global-header") :
                        CoeffsProba0[t][b][c][p];
          proba->bands[t][b].probas[c][p] = v;
        }
      }
    }
    for (b = 0; b < 16 + 1; ++b) {
      proba->bands_ptr[t][b] = &proba->bands[t][kBands[b]];
    }
  }
  dec->use_skip_proba = VP8Get(br, "global-header");
  if (dec->use_skip_proba) {
    dec->skip_p = VP8GetValue(br, 8, "global-header");
  }
}